

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O2

void co_eventloop(stCoEpoll_t *ctx,pfn_co_eventloop_t pfn,void *arg)

{
  stTimeoutItemLink_t *apResult;
  stTimeoutItemLink_t *apLink;
  stTimeoutItem_t *psVar1;
  uint uVar2;
  int iVar3;
  co_epoll_res *events;
  ulong uVar4;
  unsigned_long_long allNow;
  stTimeoutItemLink_t *psVar5;
  long lVar6;
  
  events = ctx->result;
  if (events == (co_epoll_res *)0x0) {
    events = co_epoll_res_alloc(0x2800);
    ctx->result = events;
  }
  do {
    uVar2 = co_epoll_wait(ctx->iEpollFd,events,0x2800,1);
    apResult = ctx->pstTimeoutList;
    apLink = ctx->pstActiveList;
    apResult->head = (stTimeoutItem_t *)0x0;
    apResult->tail = (stTimeoutItem_t *)0x0;
    uVar4 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar4 = 0;
    }
    for (lVar6 = 0; uVar4 * 0xc - lVar6 != 0; lVar6 = lVar6 + 0xc) {
      psVar1 = *(stTimeoutItem_t **)((long)&events->events->data + lVar6);
      if (psVar1->pfnPrepare == (OnPreparePfn_t)0x0) {
        AddTail<stTimeoutItem_t,stTimeoutItemLink_t>(apLink,psVar1);
      }
      else {
        (*psVar1->pfnPrepare)(psVar1,(epoll_event *)((long)&events->events->events + lVar6),apLink);
      }
    }
    allNow = GetTickMS();
    TakeAllTimeout(ctx->pTimeout,allNow,apResult);
    psVar5 = apResult;
    while (psVar1 = psVar5->head, psVar1 != (stTimeoutItem_t *)0x0) {
      psVar1->bTimeout = true;
      psVar5 = (stTimeoutItemLink_t *)&psVar1->pNext;
    }
    Join<stTimeoutItem_t,stTimeoutItemLink_t>(apLink,apResult);
    while (psVar1 = apLink->head, psVar1 != (stTimeoutItem_t *)0x0) {
      PopHead<stTimeoutItem_t,stTimeoutItemLink_t>(apLink);
      if (((psVar1->bTimeout == true) && (allNow < psVar1->ullExpireTime)) &&
         (iVar3 = AddTimeout(ctx->pTimeout,psVar1,allNow), iVar3 == 0)) {
        psVar1->bTimeout = false;
      }
      else if (psVar1->pfnProcess != (OnProcessPfn_t)0x0) {
        (*psVar1->pfnProcess)(psVar1);
      }
    }
  } while ((pfn == (pfn_co_eventloop_t)0x0) || (iVar3 = (*pfn)(arg), iVar3 != -1));
  return;
}

Assistant:

void co_eventloop( stCoEpoll_t *ctx,pfn_co_eventloop_t pfn,void *arg )
{
	if( !ctx->result )
	{
		ctx->result =  co_epoll_res_alloc( stCoEpoll_t::_EPOLL_SIZE );
	}
	co_epoll_res *result = ctx->result;


	for(;;)
	{
		int ret = co_epoll_wait( ctx->iEpollFd,result,stCoEpoll_t::_EPOLL_SIZE, 1 );

		stTimeoutItemLink_t *active = (ctx->pstActiveList);
		stTimeoutItemLink_t *timeout = (ctx->pstTimeoutList);

		memset( timeout,0,sizeof(stTimeoutItemLink_t) );

		for(int i=0;i<ret;i++)
		{
			stTimeoutItem_t *item = (stTimeoutItem_t*)result->events[i].data.ptr;
			if( item->pfnPrepare )
			{
				item->pfnPrepare( item,result->events[i],active );
			}
			else
			{
				AddTail( active,item );
			}
		}


		unsigned long long now = GetTickMS();
		TakeAllTimeout( ctx->pTimeout,now,timeout );

		stTimeoutItem_t *lp = timeout->head;
		while( lp )
		{
			//printf("raise timeout %p\n",lp);
			lp->bTimeout = true;
			lp = lp->pNext;
		}

		Join<stTimeoutItem_t,stTimeoutItemLink_t>( active,timeout );

		lp = active->head;
		while( lp )
		{

			PopHead<stTimeoutItem_t,stTimeoutItemLink_t>( active );
            if (lp->bTimeout && now < lp->ullExpireTime) 
			{
				int ret = AddTimeout(ctx->pTimeout, lp, now);
				if (!ret) 
				{
					lp->bTimeout = false;
					lp = active->head;
					continue;
				}
			}
			if( lp->pfnProcess )
			{
				lp->pfnProcess( lp );
			}

			lp = active->head;
		}
		if( pfn )
		{
			if( -1 == pfn( arg ) )
			{
				break;
			}
		}

	}
}